

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O2

MD_MARKSTACK * md_opener_stack(MD_CTX *ctx,int mark_index)

{
  MD_CHAR ch;
  MD_MARK *pMVar1;
  MD_MARKSTACK *pMVar2;
  
  ch = ctx->marks[mark_index].ch;
  if (ch == '!') {
LAB_00109460:
    return ctx->opener_stacks + 0xe;
  }
  pMVar1 = ctx->marks + mark_index;
  if (ch != '*') {
    if (ch == '[') goto LAB_00109460;
    if (ch == '~') {
      return ctx->opener_stacks + (ulong)(pMVar1->end - pMVar1->beg != 1) + 0xc;
    }
  }
  pMVar2 = md_emph_stack(ctx,ch,(uint)pMVar1->flags);
  return pMVar2;
}

Assistant:

static MD_MARKSTACK*
md_opener_stack(MD_CTX* ctx, int mark_index)
{
    MD_MARK* mark = &ctx->marks[mark_index];

    switch(mark->ch) {
        case _T('*'):
        case _T('_'):   return md_emph_stack(ctx, mark->ch, mark->flags);

        case _T('~'):   return (mark->end - mark->beg == 1) ? &TILDE_OPENERS_1 : &TILDE_OPENERS_2;

        case _T('!'):
        case _T('['):   return &BRACKET_OPENERS;

        default:        MD_UNREACHABLE();
    }
}